

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_compatptr(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  int iVar1;
  CTInfo local_34;
  CTInfo local_30;
  CTInfo squal;
  CTInfo dqual;
  CTInfo flags_local;
  CType *s_local;
  CType *d_local;
  CTState *cts_local;
  
  if (((flags & 1) == 0) && (d != s)) {
    local_30 = 0;
    local_34 = 0;
    squal = flags;
    _dqual = s;
    s_local = d;
    d_local = (CType *)cts;
    s_local = cconv_childqual(cts,d,&local_30);
    if (_dqual->info >> 0x1c != 1) {
      _dqual = cconv_childqual((CTState *)d_local,_dqual,&local_34);
    }
    if ((squal & 4) == 0) {
      if ((squal & 8) == 0) {
        if ((local_30 & local_34) != local_34) {
          return 0;
        }
        if ((s_local->info >> 0x1c == 4) || (_dqual->info >> 0x1c == 4)) {
          return 1;
        }
      }
    }
    else if (local_30 != local_34) {
      return 0;
    }
    if ((s_local->info >> 0x1c != _dqual->info >> 0x1c) || (s_local->size != _dqual->size)) {
      return 0;
    }
    if (s_local->info >> 0x1c == 0) {
      if (((s_local->info ^ _dqual->info) & 0xc000000) != 0) {
        return 0;
      }
    }
    else {
      if (s_local->info >> 0x1d == 1) {
        iVar1 = lj_cconv_compatptr((CTState *)d_local,s_local,_dqual,squal | 4);
        return iVar1;
      }
      if ((s_local->info >> 0x1c == 1) && (s_local != _dqual)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int lj_cconv_compatptr(CTState *cts, CType *d, CType *s, CTInfo flags)
{
  if (!((flags & CCF_CAST) || d == s)) {
    CTInfo dqual = 0, squal = 0;
    d = cconv_childqual(cts, d, &dqual);
    if (!ctype_isstruct(s->info))
      s = cconv_childqual(cts, s, &squal);
    if ((flags & CCF_SAME)) {
      if (dqual != squal)
	return 0;  /* Different qualifiers. */
    } else if (!(flags & CCF_IGNQUAL)) {
      if ((dqual & squal) != squal)
	return 0;  /* Discarded qualifiers. */
      if (ctype_isvoid(d->info) || ctype_isvoid(s->info))
	return 1;  /* Converting to/from void * is always ok. */
    }
    if (ctype_type(d->info) != ctype_type(s->info) ||
	d->size != s->size)
      return 0;  /* Different type or different size. */
    if (ctype_isnum(d->info)) {
      if (((d->info ^ s->info) & (CTF_BOOL|CTF_FP)))
	return 0;  /* Different numeric types. */
    } else if (ctype_ispointer(d->info)) {
      /* Check child types for compatibility. */
      return lj_cconv_compatptr(cts, d, s, flags|CCF_SAME);
    } else if (ctype_isstruct(d->info)) {
      if (d != s)
	return 0;  /* Must be exact same type for struct/union. */
    } else if (ctype_isfunc(d->info)) {
      /* NYI: structural equality of functions. */
    }
  }
  return 1;  /* Types are compatible. */
}